

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpCreateJ(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 in_RCX;
  code *pcVar10;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  word *in_R8;
  bool bVar11;
  word *t;
  bool_t bA3;
  size_t in_stack_ffffffffffffff58;
  word *in_stack_ffffffffffffff60;
  word *in_stack_ffffffffffffff68;
  word *in_stack_ffffffffffffff70;
  word *in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  word *in_stack_ffffffffffffff88;
  word *in_stack_ffffffffffffff90;
  
  iVar1 = wwCmpW(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                 (word)in_stack_ffffffffffffff60);
  if (0 < iVar1) {
    memSet(in_stack_ffffffffffffff60,(octet)(in_stack_ffffffffffffff58 >> 0x38),0x171c47);
    in_RDI[9] = 3;
    in_RDI[3] = in_RSI;
    in_RDI[4] = (long)(in_RDI + 0x16);
    in_RDI[5] = in_RDI[4] + *(long *)(in_RSI + 0x30) * 8;
    iVar1 = (**(code **)(in_RDI[3] + 0x40))(in_RDI[4],in_RDX,in_RDI[3],in_R8);
    if ((iVar1 != 0) &&
       (iVar1 = (**(code **)(in_RDI[3] + 0x40))(in_RDI[5],in_RCX,in_RDI[3],in_R8), iVar1 != 0)) {
      zzDoubleMod(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  (size_t)in_stack_ffffffffffffff78);
      zzAddMod(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
      zzNegMod(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
      iVar1 = wwCmp(in_R8,(word *)in_RDI[4],*(size_t *)(in_RSI + 0x30));
      bVar11 = iVar1 == 0;
      in_RDI[6] = in_RDI[5] + *(long *)(in_RSI + 0x30) * 8;
      in_RDI[7] = in_RDI[6] + *(long *)(in_RSI + 0x30) * 0x10;
      in_RDI[0xb] = (long)ecpFromAJ;
      in_RDI[0xc] = (long)ecpToAJ;
      in_RDI[0xd] = (long)ecpNegJ;
      in_RDI[0xe] = (long)ecpAddJ;
      in_RDI[0xf] = (long)ecpAddAJ;
      in_RDI[0x10] = (long)ecpSubJ;
      in_RDI[0x11] = (long)ecpSubAJ;
      pcVar10 = ecpDblJ;
      if (bVar11) {
        pcVar10 = ecpDblJA3;
      }
      in_RDI[0x12] = (long)pcVar10;
      in_RDI[0x13] = (long)ecpDblAJ;
      pcVar10 = ecpTplJ;
      if (bVar11) {
        pcVar10 = ecpTplJA3;
      }
      in_RDI[0x14] = (long)pcVar10;
      sVar2 = ecpToAJ_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      sVar3 = ecpAddJ_deep((size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      sVar4 = ecpAddAJ_deep((size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      sVar5 = ecpSubJ_deep((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      sVar6 = ecpSubAJ_deep((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar11) {
        sVar7 = ecpDblJA3_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      }
      else {
        sVar7 = ecpDblJ_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      }
      sVar8 = ecpDblAJ_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      if (bVar11) {
        sVar9 = ecpTplJA3_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      }
      else {
        sVar9 = ecpTplJ_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
      }
      sVar2 = utilMax(8,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8,sVar9);
      in_RDI[0x15] = sVar2;
      *in_RDI = (*(long *)(in_RSI + 0x30) * 5 + 1) * 8 + 0xb0;
      in_RDI[1] = 6;
      in_RDI[2] = 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

bool_t ecpCreateJ(ec_o* ec, const qr_o* f, const octet A[], const octet B[], 
	void* stack)
{
	register bool_t bA3;
	word* t;
	// pre
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gfpIsOperable(f));
	ASSERT(memIsValid(A, f->no)); 
	ASSERT(memIsValid(B, f->no));
	// f->mod > 3?
	if (wwCmpW(f->mod, f->n, 3) <= 0)
		return FALSE;
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// t <- -3
	t = (word*)stack;
	gfpDouble(t, f->unity, f);
	zmAdd(t, t, f->unity, f);
	zmNeg(t, t, f);
	// bA3 <- A == -3?
	bA3 = qrCmp(t, ec->A, f) == 0;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ecpFromAJ;
	ec->toa = ecpToAJ;
	ec->neg = ecpNegJ;
	ec->add = ecpAddJ;
	ec->adda = ecpAddAJ;
	ec->sub = ecpSubJ;
	ec->suba = ecpSubAJ;
	ec->dbl = bA3 ? ecpDblJA3 : ecpDblJ;
	ec->dbla = ecpDblAJ;
	ec->tpl = bA3 ? ecpTplJA3 : ecpTplJ;
	ec->deep = utilMax(8,
		ecpToAJ_deep(f->n, f->deep),
		ecpAddJ_deep(f->n, f->deep),
		ecpAddAJ_deep(f->n, f->deep),
		ecpSubJ_deep(f->n, f->deep),
		ecpSubAJ_deep(f->n, f->deep),
		bA3 ? ecpDblJA3_deep(f->n, f->deep) : ecpDblJ_deep(f->n, f->deep),
		ecpDblAJ_deep(f->n, f->deep),
		bA3 ? ecpTplJA3_deep(f->n, f->deep) : ecpTplJ_deep(f->n, f->deep));
	// настроить
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	bA3 = 0;
	return TRUE;
}